

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_set.cpp
# Opt level: O0

int main(void)

{
  initializer_list<Color> ilist;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
  local_a8;
  value_type local_74;
  pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
  local_70;
  value_type local_40;
  Color local_3c [3];
  iterator local_30;
  undefined8 local_28;
  undefined1 local_20 [8];
  set<Color,_std::less<Color>_> color_set;
  
  color_set.s._4_4_ = 0;
  std::ostream::operator<<((ostream *)&std::cout,std::boolalpha);
  local_3c[0] = RED;
  local_3c[1] = 2;
  local_3c[2] = 4;
  local_30 = local_3c;
  local_28 = 3;
  ilist._M_len = 3;
  ilist._M_array = local_30;
  magic_enum::containers::set<Color,_std::less<Color>_>::set
            ((set<Color,_std::less<Color>_> *)local_20,ilist);
  bVar1 = magic_enum::containers::set<Color,_std::less<Color>_>::empty
                    ((set<Color,_std::less<Color>_> *)local_20);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = magic_enum::containers::set<Color,_std::less<Color>_>::size
                    ((set<Color,_std::less<Color>_> *)local_20);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  magic_enum::containers::set<Color,_std::less<Color>_>::clear
            ((set<Color,_std::less<Color>_> *)local_20);
  bVar1 = magic_enum::containers::set<Color,_std::less<Color>_>::empty
                    ((set<Color,_std::less<Color>_> *)local_20);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = magic_enum::containers::set<Color,_std::less<Color>_>::size
                    ((set<Color,_std::less<Color>_> *)local_20);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_40 = GREEN;
  magic_enum::containers::set<Color,_std::less<Color>_>::insert
            (&local_70,(set<Color,_std::less<Color>_> *)local_20,&local_40);
  local_74 = BLUE;
  magic_enum::containers::set<Color,_std::less<Color>_>::insert
            (&local_a8,(set<Color,_std::less<Color>_> *)local_20,&local_74);
  bVar1 = magic_enum::containers::set<Color,_std::less<Color>_>::empty
                    ((set<Color,_std::less<Color>_> *)local_20);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = magic_enum::containers::set<Color,_std::less<Color>_>::size
                    ((set<Color,_std::less<Color>_> *)local_20);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {

  std::cout << std::boolalpha;
  magic_enum::containers::set color_set {Color::RED, Color::GREEN, Color::BLUE};
  std::cout << color_set.empty() << std::endl; // false
  std::cout << color_set.size() << std::endl; // 3

  color_set.clear();
  std::cout << color_set.empty() << std::endl; // true
  std::cout << color_set.size() << std::endl; // 0

  color_set.insert(Color::GREEN);
  color_set.insert(Color::BLUE);
  std::cout << color_set.empty() << std::endl; // false
  std::cout << color_set.size() << std::endl; // 2

  return 0;
}